

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11.c
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s;
  LIBSSH2_CHANNEL *pLVar1;
  chan_X11_list *pcVar2;
  chan_X11_list *pcVar3;
  unsigned_short uVar4;
  unsigned_short uVar5;
  unsigned_short uVar6;
  unsigned_short uVar7;
  __fd_mask _Var8;
  __fd_mask _Var9;
  in_addr_t iVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  undefined8 uVar15;
  size_t sVar16;
  size_t sVar17;
  long lVar18;
  char *pcVar19;
  undefined1 *__ptr;
  void *__ptr_00;
  undefined1 *__ptr_01;
  ssize_t sVar20;
  chan_X11_list *pcVar21;
  chan_X11_list *__ptr_02;
  bool bVar22;
  winsize w_size;
  timeval timeval_out;
  timeval local_158;
  fd_set set_1;
  fd_set set;
  sockaddr_in sin;
  
  timeval_out.tv_sec = 0;
  timeval_out.tv_usec = 10;
  if (argc < 4) {
    main_cold_1();
  }
  else {
    iVar10 = inet_addr(argv[1]);
    pcVar19 = argv[2];
    __s = argv[3];
    if (argc != 4) {
      main_cold_2();
    }
    uVar11 = libssh2_init(0);
    if (uVar11 != 0) {
      fprintf(_stderr,"libssh2 initialization failed (%d)\n",(ulong)uVar11);
      return 1;
    }
    iVar12 = socket(2,1,0);
    if (iVar12 == -1) {
      main_cold_11();
    }
    else {
      sin.sin_family = 2;
      sin.sin_port = 0x1600;
      sin.sin_addr.s_addr = iVar10;
      iVar13 = connect(iVar12,(sockaddr *)&sin,0x10);
      if (iVar13 == 0) {
        uVar15 = libssh2_session_init_ex(0,0,0,0);
        iVar12 = libssh2_session_handshake(uVar15,iVar12);
        if (iVar12 == 0) {
          if (argc != 4) {
            libssh2_trace(uVar15,0x10);
          }
          libssh2_session_callback_set(uVar15,4,x11_callback);
          sVar16 = strlen(pcVar19);
          sVar17 = strlen(__s);
          iVar12 = libssh2_userauth_password_ex
                             (uVar15,pcVar19,sVar16 & 0xffffffff,__s,sVar17 & 0xffffffff,0);
          if (iVar12 == 0) {
            lVar18 = libssh2_channel_open_ex(uVar15,"session",7,0x200000,0x8000,0,0);
            if (lVar18 == 0) {
              main_cold_10();
            }
            else {
              iVar12 = libssh2_channel_request_pty_ex(lVar18,"xterm",5,0,0,0x50,0x18,0,0);
              if (iVar12 == 0) {
                iVar12 = libssh2_channel_x11_req_ex(lVar18,0,0,0,0);
                if (iVar12 == 0) {
                  iVar12 = libssh2_channel_process_startup(lVar18,"shell",5,0,0);
                  if (iVar12 == 0) {
                    iVar12 = fileno(_stdin);
                    iVar12 = tcgetattr(iVar12,(termios *)&set_1);
                    _Var8 = set_1.__fds_bits[0];
                    if (iVar12 != -1) {
                      _saved_tio.c_ospeed = (speed_t)set_1.__fds_bits[7];
                      _saved_tio.c_ispeed = set_1.__fds_bits[6]._4_4_;
                      _saved_tio.c_cc[0x1f] = (cc_t)set_1.__fds_bits[6];
                      _saved_tio._49_3_ = set_1.__fds_bits[6]._1_3_;
                      set_1.__fds_bits[0] = set_1.__fds_bits[0] & 0xfffffffefffffa14;
                      _Var9 = set_1.__fds_bits[0];
                      _saved_tio.c_cc[0xf] = (undefined1)set_1.__fds_bits[4];
                      _saved_tio.c_cc[0x10] = set_1.__fds_bits[4]._1_1_;
                      _saved_tio.c_cc[0x11] = set_1.__fds_bits[4]._2_1_;
                      _saved_tio.c_cc[0x12] = set_1.__fds_bits[4]._3_1_;
                      _saved_tio.c_cc[0x13] = set_1.__fds_bits[4]._4_1_;
                      _saved_tio.c_cc[0x14] = set_1.__fds_bits[4]._5_1_;
                      _saved_tio.c_cc[0x15] = set_1.__fds_bits[4]._6_1_;
                      _saved_tio.c_cc[0x16] = set_1.__fds_bits[4]._7_1_;
                      _saved_tio.c_cc[0x17] = (cc_t)set_1.__fds_bits[5];
                      _saved_tio.c_cc[0x18] = set_1.__fds_bits[5]._1_1_;
                      _saved_tio.c_cc[0x19] = set_1.__fds_bits[5]._2_1_;
                      _saved_tio.c_cc[0x1a] = set_1.__fds_bits[5]._3_1_;
                      _saved_tio.c_cc[0x1b] = set_1.__fds_bits[5]._4_1_;
                      _saved_tio.c_cc[0x1c] = set_1.__fds_bits[5]._5_1_;
                      _saved_tio.c_cc[0x1d] = set_1.__fds_bits[5]._6_1_;
                      _saved_tio.c_cc[0x1e] = set_1.__fds_bits[5]._7_1_;
                      _saved_tio.c_line = (undefined1)set_1.__fds_bits[2];
                      _saved_tio.c_cc[0] = set_1.__fds_bits[2]._1_1_;
                      _saved_tio.c_cc[1] = set_1.__fds_bits[2]._2_1_;
                      _saved_tio.c_cc[2] = set_1.__fds_bits[2]._3_1_;
                      _saved_tio.c_cc[3] = set_1.__fds_bits[2]._4_1_;
                      _saved_tio.c_cc[4] = set_1.__fds_bits[2]._5_1_;
                      _saved_tio.c_cc[5] = set_1.__fds_bits[2]._6_1_;
                      _saved_tio.c_cc[6] = set_1.__fds_bits[2]._7_1_;
                      _saved_tio.c_cc[7] = (undefined1)set_1.__fds_bits[3];
                      _saved_tio.c_cc[8] = set_1.__fds_bits[3]._1_1_;
                      _saved_tio.c_cc[9] = set_1.__fds_bits[3]._2_1_;
                      _saved_tio.c_cc[10] = set_1.__fds_bits[3]._3_1_;
                      _saved_tio.c_cc[0xb] = set_1.__fds_bits[3]._4_1_;
                      _saved_tio.c_cc[0xc] = set_1.__fds_bits[3]._5_1_;
                      _saved_tio.c_cc[0xd] = set_1.__fds_bits[3]._6_1_;
                      _saved_tio.c_cc[0xe] = set_1.__fds_bits[3]._7_1_;
                      set_1.__fds_bits[0]._0_4_ = (undefined4)_Var8;
                      set_1.__fds_bits[0]._4_4_ = SUB84(_Var8,4);
                      _saved_tio.c_iflag = (undefined4)set_1.__fds_bits[0];
                      _saved_tio.c_oflag = set_1.__fds_bits[0]._4_4_;
                      _saved_tio.c_cflag = (undefined4)set_1.__fds_bits[1];
                      _saved_tio.c_lflag = set_1.__fds_bits[1]._4_4_;
                      set_1.__fds_bits[1] = set_1.__fds_bits[1] & 0xffff7fb4fffffecfU | 0x30;
                      set_1.__fds_bits[0] = _Var9;
                      iVar12 = fileno(_stdin);
                      iVar12 = tcsetattr(iVar12,1,(termios *)&set_1);
                      if (iVar12 == 0) {
                        w_size.ws_row = 0;
                        w_size.ws_col = 0;
                        w_size.ws_xpixel = 0;
                        w_size.ws_ypixel = 0;
                        uVar5 = 0;
                        uVar4 = 0;
LAB_00102973:
                        set.__fds_bits[0xe] = 0;
                        set.__fds_bits[0xf] = 0;
                        set.__fds_bits[0xc] = 0;
                        set.__fds_bits[0xd] = 0;
                        set.__fds_bits[10] = 0;
                        set.__fds_bits[0xb] = 0;
                        set.__fds_bits[8] = 0;
                        set.__fds_bits[9] = 0;
                        set.__fds_bits[6] = 0;
                        set.__fds_bits[7] = 0;
                        set.__fds_bits[4] = 0;
                        set.__fds_bits[5] = 0;
                        set.__fds_bits[2] = 0;
                        set.__fds_bits[3] = 0;
                        set.__fds_bits[0] = 0;
                        set.__fds_bits[1] = 0;
                        iVar13 = fileno(_stdin);
                        iVar14 = fileno(_stdin);
                        iVar12 = iVar14 + 0x3f;
                        if (-1 < iVar14) {
                          iVar12 = iVar14;
                        }
                        set.__fds_bits[iVar12 >> 6] =
                             set.__fds_bits[iVar12 >> 6] | 1L << ((byte)iVar13 & 0x3f);
                        iVar12 = fileno(_stdin);
                        ioctl(iVar12,0x5413,&w_size);
                        uVar6 = w_size.ws_row;
                        uVar7 = w_size.ws_col;
                        if (uVar4 != w_size.ws_col || uVar5 != w_size.ws_row) {
                          libssh2_channel_request_pty_size_ex
                                    (lVar18,w_size.ws_col,(ulong)w_size & 0xffff,0,0);
                          uVar4 = uVar7;
                          uVar5 = uVar6;
                        }
                        pcVar19 = (char *)calloc(0x2001,1);
                        if (pcVar19 != (char *)0x0) {
                          __ptr = (undefined1 *)malloc(0x20);
                          if (__ptr != (undefined1 *)0x0) {
                            *__ptr = 2;
                            *(long *)(__ptr + 8) = lVar18;
                            *(undefined8 *)(__ptr + 0x10) = 1;
                            *(undefined8 *)(__ptr + 0x18) = 1;
                            iVar12 = libssh2_poll(__ptr,1,0);
                            pcVar2 = gp_x11_chan;
                            if (0 < iVar12) {
                              libssh2_channel_read_ex(lVar18,0,pcVar19);
                              fputs(pcVar19,_stdout);
                              fflush(_stdout);
                              pcVar2 = gp_x11_chan;
                            }
LAB_00102ade:
                            do {
                              pcVar21 = pcVar2;
                              if (pcVar21 == (chan_X11_list *)0x0) goto LAB_00102cb6;
                              pLVar1 = pcVar21->chan;
                              iVar12 = pcVar21->sock;
                              local_158.tv_sec = 0;
                              local_158.tv_usec = 0;
                              set_1.__fds_bits[0] = 0;
                              set_1.__fds_bits[1] = 0;
                              set_1.__fds_bits[2] = 0;
                              set_1.__fds_bits[3] = 0;
                              set_1.__fds_bits[4] = 0;
                              set_1.__fds_bits[5]._0_1_ = '\0';
                              set_1.__fds_bits[5]._1_1_ = '\0';
                              set_1.__fds_bits[5]._2_1_ = '\0';
                              set_1.__fds_bits[5]._3_1_ = '\0';
                              set_1.__fds_bits[5]._4_1_ = '\0';
                              set_1.__fds_bits[5]._5_1_ = '\0';
                              set_1.__fds_bits[5]._6_1_ = '\0';
                              set_1.__fds_bits[5]._7_1_ = '\0';
                              set_1.__fds_bits[6]._0_1_ = '\0';
                              set_1.__fds_bits[6]._1_3_ = 0;
                              set_1.__fds_bits[6]._4_4_ = 0;
                              set_1.__fds_bits[7]._0_4_ = 0;
                              set_1.__fds_bits[7]._4_4_ = 0;
                              set_1.__fds_bits[8] = 0;
                              set_1.__fds_bits[9] = 0;
                              set_1.__fds_bits[10] = 0;
                              set_1.__fds_bits[0xb] = 0;
                              set_1.__fds_bits[0xc] = 0;
                              set_1.__fds_bits[0xd] = 0;
                              set_1.__fds_bits[0xe] = 0;
                              set_1.__fds_bits[0xf] = 0;
                              iVar13 = iVar12 + 0x3f;
                              if (-1 < iVar12) {
                                iVar13 = iVar12;
                              }
                              set_1.__fds_bits[iVar13 >> 6] =
                                   set_1.__fds_bits[iVar13 >> 6] |
                                   1L << ((byte)(iVar12 % 0x40) & 0x3f);
                              __ptr_00 = calloc(0x2000,1);
                              if (__ptr_00 == (void *)0x0) {
LAB_00102c20:
                                bVar22 = false;
                              }
                              else {
                                __ptr_01 = (undefined1 *)malloc(0x20);
                                if (__ptr_01 == (undefined1 *)0x0) {
                                  free(__ptr_00);
                                  goto LAB_00102c20;
                                }
                                *__ptr_01 = 2;
                                *(LIBSSH2_CHANNEL **)(__ptr_01 + 8) = pLVar1;
                                *(undefined8 *)(__ptr_01 + 0x10) = 1;
                                *(undefined8 *)(__ptr_01 + 0x18) = 1;
                                iVar13 = libssh2_poll(__ptr_01,1,0);
                                if (0 < iVar13) {
                                  sVar16 = libssh2_channel_read_ex(pLVar1,0,__ptr_00);
                                  write(iVar12,__ptr_00,sVar16);
                                }
                                iVar13 = select(iVar12 + 1,(fd_set *)&set_1,(fd_set *)0x0,
                                                (fd_set *)0x0,&local_158);
                                if (iVar13 < 1) {
LAB_00102c31:
                                  free(__ptr_01);
                                  free(__ptr_00);
                                  iVar12 = libssh2_channel_eof(pLVar1);
                                  bVar22 = iVar12 == 1;
                                }
                                else {
                                  memset(__ptr_00,0,0x2000);
                                  sVar20 = read(iVar12,__ptr_00,0x2000);
                                  if (0 < sVar20) {
                                    libssh2_channel_write_ex(pLVar1,0,__ptr_00);
                                    goto LAB_00102c31;
                                  }
                                  free(__ptr_00);
                                  bVar22 = true;
                                }
                              }
                              pcVar2 = pcVar21->next;
                              if (bVar22) {
                                shutdown(pcVar21->sock,2);
                                close(pcVar21->sock);
                                pcVar3 = gp_x11_chan->next;
                                __ptr_02 = gp_x11_chan;
                                if (gp_x11_chan != pcVar21) {
                                  if (pcVar3 == (chan_X11_list *)0x0) goto LAB_00102ade;
                                  if (pcVar3 != pcVar21) {
                                    do {
                                    } while( true );
                                  }
                                  __ptr_02 = pcVar3->next;
                                  gp_x11_chan->next = __ptr_02;
                                  pcVar3 = gp_x11_chan;
                                }
                                gp_x11_chan = pcVar3;
                                free(__ptr_02);
                              }
                            } while( true );
                          }
                          free(pcVar19);
                        }
                        goto LAB_00102d5c;
                      }
                    }
                    main_cold_9();
                  }
                  else {
                    main_cold_8();
                  }
                }
                else {
                  main_cold_7();
                }
              }
              else {
                main_cold_6();
              }
            }
          }
          else {
            main_cold_5();
          }
        }
        else {
          main_cold_4();
        }
      }
      else {
        main_cold_3();
      }
    }
  }
  return -1;
LAB_00102cb6:
  iVar12 = fileno(_stdin);
  iVar12 = select(iVar12 + 1,(fd_set *)&set,(fd_set *)0x0,(fd_set *)0x0,(timeval *)&timeval_out);
  if (0 < iVar12) {
    iVar12 = fileno(_stdin);
    sVar20 = read(iVar12,pcVar19,1);
    if (0 < sVar20) {
      libssh2_channel_write_ex(lVar18,0,pcVar19,8);
    }
  }
  free(__ptr);
  free(pcVar19);
  iVar12 = libssh2_channel_eof(lVar18);
  if (iVar12 == 1) {
LAB_00102d5c:
    libssh2_channel_free(lVar18);
    iVar12 = fileno(_stdin);
    tcsetattr(iVar12,1,(termios *)&_saved_tio);
    libssh2_exit();
    return 0;
  }
  goto LAB_00102973;
}

Assistant:

int main(int argc, char *argv[])
{
    uint32_t hostaddr = 0;
    int rc;
    libssh2_socket_t sock = LIBSSH2_INVALID_SOCKET;
    struct sockaddr_in sin;
    LIBSSH2_SESSION *session = NULL;
    LIBSSH2_CHANNEL *channel;
    char *username = NULL;
    char *password = NULL;
    size_t bufsiz = 8193;
    char *buf = NULL;
    int set_debug_on = 0;
    int nfds = 1;
    LIBSSH2_POLLFD *fds = NULL;

    /* Chan List struct */
    struct chan_X11_list *current_node = NULL;

    /* Struct winsize for term size */
    struct winsize w_size;
    struct winsize w_size_bck;

    /* For select on stdin */
    fd_set set;
    struct timeval timeval_out;
    timeval_out.tv_sec = 0;
    timeval_out.tv_usec = 10;

    if(argc > 3) {
        hostaddr = inet_addr(argv[1]);
        username = argv[2];
        password = argv[3];
    }
    else {
        fprintf(stderr, "Usage: %s destination username password",
                argv[0]);
        return -1;
    }

    if(argc > 4) {
        set_debug_on = 1;
        fprintf(stderr, "DEBUG is ON: %d\n", set_debug_on);
    }

    rc = libssh2_init(0);
    if(rc) {
        fprintf(stderr, "libssh2 initialization failed (%d)\n", rc);
        return 1;
    }

    sock = socket(AF_INET, SOCK_STREAM, 0);
    if(sock == LIBSSH2_INVALID_SOCKET) {
        fprintf(stderr, "failed to open socket!\n");
        return -1;
    }

    sin.sin_family = AF_INET;
    sin.sin_port = htons(22);
    sin.sin_addr.s_addr = hostaddr;

    if(connect(sock, (struct sockaddr*)(&sin), sizeof(struct sockaddr_in))) {
        fprintf(stderr, "Failed to established connection!\n");
        return -1;
    }
    /* Open a session */
    session = libssh2_session_init();
    rc      = libssh2_session_handshake(session, sock);
    if(rc) {
        fprintf(stderr, "Failed Start the SSH session\n");
        return -1;
    }

    if(set_debug_on == 1)
        libssh2_trace(session, LIBSSH2_TRACE_CONN);

    /* ignore pedantic warnings by gcc on the callback argument */
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wpedantic"
    /* Set X11 Callback */
    libssh2_session_callback_set(session, LIBSSH2_CALLBACK_X11,
                                 (void *)x11_callback);
#pragma GCC diagnostic pop

    /* Authenticate via password */
    rc = libssh2_userauth_password(session, username, password);
    if(rc) {
        fprintf(stderr, "Failed to authenticate\n");
        session_shutdown(session);
        shutdown(sock, SHUT_RDWR);
        close(sock);
        return -1;
    }

    /* Open a channel */
    channel = libssh2_channel_open_session(session);
    if(!channel) {
        fprintf(stderr, "Failed to open a new channel\n");
        session_shutdown(session);
        shutdown(sock, SHUT_RDWR);
        close(sock);
        return -1;
    }

    /* Request a PTY */
    rc = libssh2_channel_request_pty(channel, "xterm");
    if(rc) {
        fprintf(stderr, "Failed to request a pty\n");
        session_shutdown(session);
        shutdown(sock, SHUT_RDWR);
        close(sock);
        return -1;
    }

    /* Request X11 */
    rc = libssh2_channel_x11_req(channel, 0);
    if(rc) {
        fprintf(stderr, "Failed to request X11 forwarding\n");
        session_shutdown(session);
        shutdown(sock, SHUT_RDWR);
        close(sock);
        return -1;
    }

    /* Request a shell */
    rc = libssh2_channel_shell(channel);
    if(rc) {
        fprintf(stderr, "Failed to open a shell\n");
        session_shutdown(session);
        shutdown(sock, SHUT_RDWR);
        close(sock);
        return -1;
    }

    rc = _raw_mode();
    if(rc) {
        fprintf(stderr, "Failed to entered in raw mode\n");
        session_shutdown(session);
        shutdown(sock, SHUT_RDWR);
        close(sock);
        return -1;
    }

    memset(&w_size, 0, sizeof(struct winsize));
    memset(&w_size_bck, 0, sizeof(struct winsize));

    for(;;) {

        FD_ZERO(&set);
        FD_SET(fileno(stdin), &set);

        /* Search if a resize pty has to be send */
        ioctl(fileno(stdin), TIOCGWINSZ, &w_size);
        if((w_size.ws_row != w_size_bck.ws_row) ||
           (w_size.ws_col != w_size_bck.ws_col)) {
            w_size_bck = w_size;

            libssh2_channel_request_pty_size(channel,
                                             w_size.ws_col,
                                             w_size.ws_row);
        }

        buf = calloc(bufsiz, sizeof(char));
        if(!buf)
            break;

        fds = malloc(sizeof(LIBSSH2_POLLFD));
        if(!fds) {
            free(buf);
            break;
        }

        fds[0].type = LIBSSH2_POLLFD_CHANNEL;
        fds[0].fd.channel = channel;
        fds[0].events = LIBSSH2_POLLFD_POLLIN;
        fds[0].revents = LIBSSH2_POLLFD_POLLIN;

        rc = libssh2_poll(fds, nfds, 0);
        if(rc > 0) {
            libssh2_channel_read(channel, buf, sizeof(buf));
            fprintf(stdout, "%s", buf);
            fflush(stdout);
        }

        /* Looping on X clients */
        if(gp_x11_chan) {
            current_node = gp_x11_chan;
        }
        else
            current_node = NULL;

        while(current_node) {
            struct chan_X11_list *next_node;
            rc = x11_send_receive(current_node->chan, current_node->sock);
            next_node = current_node->next;
            if(rc == -1) {
                shutdown(current_node->sock, SHUT_RDWR);
                close(current_node->sock);
                remove_node(current_node);
            }

            current_node = next_node;
        }

        rc = select((int)(fileno(stdin) + 1), &set, NULL, NULL, &timeval_out);
        if(rc > 0) {
            ssize_t nread;

            /* Data in stdin */
            nread = read(fileno(stdin), buf, 1);
            if(nread > 0)
                libssh2_channel_write(channel, buf, sizeof(buf));
        }

        free(fds);
        free(buf);

        if(libssh2_channel_eof(channel) == 1) {
            break;
        }
    }

    if(channel) {
        libssh2_channel_free(channel);
        channel = NULL;
    }
    _normal_mode();

    libssh2_exit();

    return 0;
}